

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  float *pfVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  int k_1;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  size_type __n;
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  int k;
  int iVar26;
  int iVar27;
  ulong uVar28;
  int i_3;
  ulong uVar29;
  int iVar30;
  int i_7;
  ulong uVar31;
  uint uVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  Mat m;
  int local_168;
  long local_150;
  Mat top_blob_bordered;
  long local_f8;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  
  iVar12 = bottom_blob->c;
  if (iVar12 % this->group != 0) {
    return -100;
  }
  iVar26 = this->num_output;
  if (iVar26 % this->group != 0) {
    return -100;
  }
  uVar3 = bottom_blob->w;
  uVar32 = bottom_blob->h;
  uVar13 = (ulong)uVar32;
  sVar4 = bottom_blob->elemsize;
  iVar24 = this->kernel_w;
  iVar30 = this->dilation_w;
  iVar27 = this->kernel_h;
  iVar17 = this->dilation_h;
  iVar18 = this->stride_w;
  iVar21 = this->stride_h;
  top_blob_bordered.elemsize = 0;
  top_blob_bordered.elempack = 0;
  top_blob_bordered.data = (void *)0x0;
  top_blob_bordered.refcount._0_4_ = 0;
  top_blob_bordered.refcount._4_4_ = 0;
  top_blob_bordered.allocator = (Allocator *)0x0;
  top_blob_bordered.dims = 0;
  top_blob_bordered.w = 0;
  top_blob_bordered.h = 0;
  top_blob_bordered.c = 0;
  top_blob_bordered.cstep = 0;
  auVar35._0_4_ = -(uint)(0 < this->pad_left);
  auVar35._4_4_ = -(uint)(0 < this->pad_right);
  auVar35._8_4_ = -(uint)(0 < this->pad_top);
  auVar35._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar16 = movmskps(uVar32,auVar35);
  lVar22 = 0x10;
  if ((((iVar16 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    Mat::operator=(&top_blob_bordered,top_blob);
    iVar26 = this->num_output;
    lVar22 = 8;
  }
  iVar30 = (uVar3 - 1) * iVar18 + (iVar24 + -1) * iVar30 + 1;
  iVar24 = (iVar27 + -1) * iVar17 + 1 + (uVar32 - 1) * iVar21;
  Mat::create(&top_blob_bordered,iVar30,iVar24,iVar26,sVar4,
              *(Allocator **)(&opt->lightmode + lVar22));
  iVar26 = -100;
  if (top_blob_bordered.data == (void *)0x0) goto LAB_0015323e;
  if ((long)top_blob_bordered.c * top_blob_bordered.cstep == 0) goto LAB_0015323e;
  uVar10 = this->kernel_w * this->kernel_h;
  __n = (size_type)(int)uVar10;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
  iVar26 = this->dilation_h;
  iVar27 = this->kernel_w;
  iVar17 = this->dilation_w * iVar27;
  iVar21 = 0;
  lVar22 = 0;
  for (iVar18 = 0; iVar18 < this->kernel_h; iVar18 = iVar18 + 1) {
    for (lVar25 = 0; (int)lVar25 < iVar27; lVar25 = lVar25 + 1) {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar22 + lVar25] = iVar21;
      iVar21 = iVar21 + this->dilation_w;
      iVar27 = this->kernel_w;
    }
    iVar21 = iVar21 + (iVar26 * iVar30 - iVar17);
    lVar22 = (int)lVar22 + lVar25;
  }
  iVar26 = this->group;
  if (iVar26 == this->num_output && iVar12 == iVar26) {
    uVar31 = 0;
    if (0 < (int)uVar10) {
      uVar31 = (ulong)uVar10;
    }
    uVar19 = 0;
    if (0 < (int)uVar3) {
      uVar19 = (ulong)uVar3;
    }
    if ((int)uVar32 < 1) {
      uVar13 = 0;
    }
    local_150 = 0;
    uVar32 = iVar24 * iVar30;
    if (iVar24 * iVar30 < 1) {
      uVar32 = 0;
    }
    uVar29 = (ulong)uVar32;
    for (lVar22 = 0; iVar26 = iVar12, lVar22 < iVar12; lVar22 = lVar22 + 1) {
      Mat::channel(&m,bottom_blob,(int)lVar22);
      pvVar7 = m.data;
      Mat::~Mat(&m);
      pvVar5 = (this->weight_data).data;
      m.data = (void *)(top_blob_bordered.cstep * lVar22 * top_blob_bordered.elemsize +
                       (long)top_blob_bordered.data);
      m.refcount = (int *)0x0;
      m.elemsize = top_blob_bordered.elemsize;
      m.elempack = top_blob_bordered.elempack;
      m.allocator = top_blob_bordered.allocator;
      m.w = top_blob_bordered.w;
      m.dims = 2;
      m.c = 1;
      m.h = top_blob_bordered.h;
      m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
      if (this->bias_term == 0) {
        fVar33 = 0.0;
      }
      else {
        fVar33 = *(float *)((long)(this->bias_data).data + lVar22 * 4);
      }
      Mat::fill(&m,fVar33);
      pvVar8 = m.data;
      for (uVar14 = 0; uVar14 != uVar13; uVar14 = uVar14 + 1) {
        iVar12 = this->stride_h;
        iVar26 = this->stride_w;
        for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
          lVar25 = uVar23 * (long)iVar26 * 4 +
                   (long)m.w * (long)(int)uVar14 * (long)iVar12 * m.elemsize;
          for (uVar28 = 0; uVar31 != uVar28; uVar28 = uVar28 + 1) {
            *(float *)((long)m.data +
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar28] * 4 + lVar25) =
                 *(float *)((long)pvVar5 + uVar28 * 4 + local_150) *
                 *(float *)((long)pvVar7 + uVar23 * 4 + uVar14 * (long)(int)uVar3 * 4) +
                 *(float *)((long)m.data +
                           (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar28] * 4 + lVar25);
          }
        }
      }
      switch(this->activation_type) {
      case 1:
        for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
          fVar33 = *(float *)((long)m.data + uVar14 * 4);
          if (fVar33 <= 0.0) {
            fVar33 = 0.0;
          }
          *(float *)((long)m.data + uVar14 * 4) = fVar33;
        }
        break;
      case 2:
        uVar32 = *(this->activation_params).data;
        for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
          fVar33 = *(float *)((long)m.data + uVar14 * 4);
          uVar10 = -(uint)(0.0 < fVar33);
          *(float *)((long)m.data + uVar14 * 4) =
               (float)(~uVar10 & uVar32 | uVar10 & 0x3f800000) * fVar33;
        }
        break;
      case 3:
        pfVar6 = (float *)(this->activation_params).data;
        fVar33 = *pfVar6;
        fVar1 = pfVar6[1];
        for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
          fVar2 = *(float *)((long)m.data + uVar14 * 4);
          fVar36 = fVar2;
          if (fVar2 <= fVar33) {
            fVar36 = fVar33;
          }
          if ((fVar2 < fVar33) || (fVar1 < fVar36)) {
            if (fVar1 <= fVar36) {
              fVar36 = fVar1;
            }
            *(float *)((long)m.data + uVar14 * 4) = fVar36;
          }
        }
        break;
      case 4:
        for (uVar14 = 0; uVar29 != uVar14; uVar14 = uVar14 + 1) {
          fVar33 = expf(-*(float *)((long)pvVar8 + uVar14 * 4));
          *(float *)((long)pvVar8 + uVar14 * 4) = 1.0 / (fVar33 + 1.0);
        }
      }
      Mat::~Mat(&m);
      iVar12 = this->group;
      local_150 = local_150 + __n * 4;
    }
  }
  else {
    iVar12 = iVar12 / iVar26;
    uVar11 = this->num_output / iVar26;
    uVar19 = 0;
    uVar31 = 0;
    if (0 < (int)uVar10) {
      uVar31 = (ulong)uVar10;
    }
    iVar27 = 0;
    if (0 < iVar12) {
      iVar27 = iVar12;
    }
    uVar29 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar29 = uVar19;
    }
    if ((int)uVar32 < 1) {
      uVar13 = uVar19;
    }
    uVar14 = 0;
    if (0 < (int)uVar11) {
      uVar14 = (ulong)uVar11;
    }
    iVar17 = 0;
    uVar23 = (ulong)(uint)(iVar24 * iVar30);
    if (iVar24 * iVar30 < 1) {
      uVar23 = uVar19;
    }
    for (lVar22 = 0; lVar22 < iVar26; lVar22 = lVar22 + 1) {
      local_f8 = (long)iVar17 << 2;
      for (uVar19 = 0; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        lVar25 = lVar22 * (int)uVar11 + uVar19;
        m.data = (void *)(top_blob_bordered.cstep * lVar25 * top_blob_bordered.elemsize +
                         (long)top_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.elemsize = top_blob_bordered.elemsize;
        m.elempack = top_blob_bordered.elempack;
        m.allocator = top_blob_bordered.allocator;
        m.w = top_blob_bordered.w;
        m.dims = 2;
        m.c = 1;
        m.h = top_blob_bordered.h;
        m.cstep = (size_t)(top_blob_bordered.h * top_blob_bordered.w);
        if (this->bias_term == 0) {
          fVar33 = 0.0;
        }
        else {
          fVar33 = *(float *)((long)(this->bias_data).data + lVar25 * 4);
        }
        pvVar5 = (this->weight_data).data;
        Mat::fill(&m,fVar33);
        for (iVar26 = 0; pvVar7 = m.data, local_168 = (int)uVar13, iVar26 != local_168;
            iVar26 = iVar26 + 1) {
          for (uVar28 = 0; pvVar7 = m.data, uVar28 != uVar29; uVar28 = uVar28 + 1) {
            lVar25 = (long)(int)uVar28 * (long)this->stride_w * 4 +
                     (long)m.w * (long)this->stride_h * (long)iVar26 * m.elemsize;
            lVar20 = (long)pvVar5 + local_f8;
            for (iVar24 = 0; iVar24 != iVar27; iVar24 = iVar24 + 1) {
              Mat::channel(&m_1,bottom_blob,iVar24 + iVar12 * (int)lVar22);
              fVar33 = *(float *)((long)m_1.data +
                                 uVar28 * 4 + (long)m_1.w * (long)iVar26 * m_1.elemsize);
              for (uVar15 = 0; uVar31 != uVar15; uVar15 = uVar15 + 1) {
                *(float *)((long)pvVar7 +
                          (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar15] * 4 + lVar25) =
                     *(float *)(lVar20 + uVar15 * 4) * fVar33 +
                     *(float *)((long)pvVar7 +
                               (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar15] * 4 + lVar25);
              }
              Mat::~Mat(&m_1);
              lVar20 = lVar20 + __n * 4;
            }
          }
        }
        switch(this->activation_type) {
        case 1:
          for (uVar28 = 0; uVar23 != uVar28; uVar28 = uVar28 + 1) {
            fVar33 = *(float *)((long)m.data + uVar28 * 4);
            if (fVar33 <= 0.0) {
              fVar33 = 0.0;
            }
            *(float *)((long)m.data + uVar28 * 4) = fVar33;
          }
          break;
        case 2:
          uVar3 = *(this->activation_params).data;
          for (uVar28 = 0; uVar23 != uVar28; uVar28 = uVar28 + 1) {
            fVar33 = *(float *)((long)m.data + uVar28 * 4);
            uVar32 = -(uint)(0.0 < fVar33);
            *(float *)((long)m.data + uVar28 * 4) =
                 (float)(~uVar32 & uVar3 | uVar32 & 0x3f800000) * fVar33;
          }
          break;
        case 3:
          pfVar6 = (float *)(this->activation_params).data;
          fVar33 = *pfVar6;
          fVar1 = pfVar6[1];
          for (uVar28 = 0; uVar23 != uVar28; uVar28 = uVar28 + 1) {
            fVar2 = *(float *)((long)m.data + uVar28 * 4);
            fVar36 = fVar2;
            if (fVar2 <= fVar33) {
              fVar36 = fVar33;
            }
            if ((fVar2 < fVar33) || (fVar1 < fVar36)) {
              if (fVar1 <= fVar36) {
                fVar36 = fVar1;
              }
              *(float *)((long)m.data + uVar28 * 4) = fVar36;
            }
          }
          break;
        case 4:
          for (uVar28 = 0; uVar23 != uVar28; uVar28 = uVar28 + 1) {
            fVar33 = expf(-*(float *)((long)pvVar7 + uVar28 * 4));
            *(float *)((long)pvVar7 + uVar28 * 4) = 1.0 / (fVar33 + 1.0);
          }
        }
        Mat::~Mat(&m);
        local_f8 = local_f8 + (long)(int)(iVar12 * uVar10) * 4;
      }
      iVar26 = this->group;
      iVar17 = iVar17 + uVar11 * iVar12 * uVar10;
    }
  }
  auVar9 = (undefined1  [16])top_blob_bordered._48_16_;
  auVar35 = (undefined1  [16])top_blob_bordered._32_16_;
  auVar34._0_4_ = -(uint)(0 < this->pad_left);
  auVar34._4_4_ = -(uint)(0 < this->pad_right);
  auVar34._8_4_ = -(uint)(0 < this->pad_top);
  auVar34._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar12 = movmskps(iVar26,auVar34);
  if (iVar12 == 0) {
    if ((0 < this->output_w) && (0 < this->output_h)) {
      m.refcount = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_
                                  );
      m.data = top_blob_bordered.data;
      m.elemsize = top_blob_bordered.elemsize;
      m.elempack = top_blob_bordered.elempack;
      m.allocator = top_blob_bordered.allocator;
      m.dims = top_blob_bordered.dims;
      m.w = top_blob_bordered.w;
      m.h = top_blob_bordered.h;
      m.c = top_blob_bordered.c;
      m.cstep = top_blob_bordered.cstep;
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + 1;
        UNLOCK();
      }
      top_blob_bordered._32_16_ = auVar35;
      top_blob_bordered._48_16_ = auVar9;
      if (0 < this->output_pad_bottom || 0 < this->output_pad_right) {
        m_1.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        m_1.data = *(void **)opt;
        m_1.elemsize = (size_t)opt->workspace_allocator;
        m_1._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
        m_1.refcount = (int *)opt->workspace_allocator;
        copy_make_border(&top_blob_bordered,&m,0,this->output_pad_bottom,0,this->output_pad_right,0,
                         0.0,(Option *)&m_1);
        if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) goto LAB_001531ab;
      }
      iVar26 = m.w - this->output_w;
      iVar12 = m.h - this->output_h;
      if ((this->pad_left == -0xe9) ||
         (((this->pad_right == -0xe9 || (this->pad_top == -0xe9)) || (this->pad_bottom == -0xe9))))
      {
        iVar24 = iVar12 / 2;
        iVar30 = iVar12 - iVar24;
        iVar12 = iVar26 / 2;
        iVar27 = iVar26 - iVar12;
LAB_00153166:
        copy_cut_border(&m,top_blob,iVar24,iVar30,iVar12,iVar27,opt);
      }
      else if ((this->pad_top == -0xea || (this->pad_right == -0xea || this->pad_left == -0xea)) ||
               this->pad_bottom == -0xea) {
        iVar30 = iVar12 / 2;
        iVar24 = iVar12 - iVar30;
        iVar27 = iVar26 / 2;
        iVar12 = iVar26 - iVar27;
        goto LAB_00153166;
      }
      if (top_blob->data == (void *)0x0) goto LAB_001531ab;
      iVar12 = top_blob->c;
      sVar4 = top_blob->cstep;
      Mat::~Mat(&m);
      if ((long)iVar12 * sVar4 != 0) goto LAB_0015322f;
      goto LAB_001531b5;
    }
    if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
      Mat::operator=(top_blob,&top_blob_bordered);
      goto LAB_0015322f;
    }
    copy_make_border(&top_blob_bordered,top_blob,0,this->output_pad_bottom,0,this->output_pad_right,
                     0,0.0,opt);
    iVar26 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
    goto LAB_0015322f;
  }
  else {
    m.refcount = (int *)CONCAT44(top_blob_bordered.refcount._4_4_,top_blob_bordered.refcount._0_4_);
    m.data = top_blob_bordered.data;
    m.elemsize = top_blob_bordered.elemsize;
    m.elempack = top_blob_bordered.elempack;
    m.allocator = top_blob_bordered.allocator;
    m.dims = top_blob_bordered.dims;
    m.w = top_blob_bordered.w;
    m.h = top_blob_bordered.h;
    m.c = top_blob_bordered.c;
    m.cstep = top_blob_bordered.cstep;
    if (m.refcount != (int *)0x0) {
      LOCK();
      *m.refcount = *m.refcount + 1;
      UNLOCK();
    }
    top_blob_bordered._32_16_ = auVar35;
    top_blob_bordered._48_16_ = auVar9;
    if (this->output_pad_bottom < 1 && this->output_pad_right < 1) {
LAB_00152f8d:
      copy_cut_border(&m,top_blob,this->pad_top,this->pad_bottom,this->pad_left,this->pad_right,opt)
      ;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        Mat::~Mat(&m);
LAB_0015322f:
        iVar26 = 0;
        goto LAB_00153231;
      }
    }
    else {
      m_1.allocator = *(Allocator **)&opt->use_int8_arithmetic;
      m_1.data = *(void **)opt;
      m_1.elemsize = (size_t)opt->workspace_allocator;
      m_1._24_8_ = *(undefined8 *)&opt->use_winograd_convolution;
      m_1.refcount = (int *)opt->workspace_allocator;
      copy_make_border(&top_blob_bordered,&m,0,this->output_pad_bottom,0,this->output_pad_right,0,
                       0.0,(Option *)&m_1);
      if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) goto LAB_00152f8d;
    }
LAB_001531ab:
    Mat::~Mat(&m);
LAB_001531b5:
    iVar26 = -100;
  }
LAB_00153231:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_0015323e:
  Mat::~Mat(&top_blob_bordered);
  return iVar26;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}